

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

void __thiscall tinyxml2::XMLPrinter::PrintString(XMLPrinter *this,char *p,bool restricted)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  byte *pbVar5;
  
  pbVar5 = (byte *)p;
  if (this->_processEntities == true) {
    while( true ) {
      bVar1 = *p;
      if ((ulong)bVar1 == 0) break;
      if ((bVar1 < 0x40) && (this->_entityFlag[(ulong)bVar1 + (ulong)restricted * 0x40] == true)) {
        for (; pbVar5 < p; pbVar5 = pbVar5 + uVar4) {
          uVar4 = (long)p - (long)pbVar5;
          if (0x7ffffffe < uVar4) {
            uVar4 = 0x7fffffff;
          }
          Print(this,"%.*s",uVar4 & 0xffffffff,pbVar5);
        }
        lVar2 = -0x10;
        do {
          lVar3 = lVar2;
          if (lVar3 + 0x10 == 0x50) goto LAB_0010febb;
          lVar2 = lVar3 + 0x10;
        } while ((&DAT_0011a61c)[lVar3] != *p);
        Print(this,"&%s;",*(undefined8 *)((long)&PTR_anon_var_dwarf_3b5e_0011a610 + lVar3));
LAB_0010febb:
        pbVar5 = pbVar5 + 1;
      }
      p = (char *)((byte *)p + 1);
    }
    if (((this->_processEntities & 1U) != 0) && (p <= pbVar5)) {
      return;
    }
  }
  Print(this,"%s",pbVar5);
  return;
}

Assistant:

void XMLPrinter::PrintString( const char* p, bool restricted )
{
    // Look for runs of bytes between entities to print.
    const char* q = p;

    if ( _processEntities ) {
        const bool* flag = restricted ? _restrictedEntityFlag : _entityFlag;
        while ( *q ) {
            TIXMLASSERT( p <= q );
            // Remember, char is sometimes signed. (How many times has that bitten me?)
            if ( *q > 0 && *q < ENTITY_RANGE ) {
                // Check for entities. If one is found, flush
                // the stream up until the entity, write the
                // entity, and keep looking.
                if ( flag[(unsigned char)(*q)] ) {
                    while ( p < q ) {
                        const size_t delta = q - p;
                        // %.*s accepts type int as "precision"
                        const int toPrint = ( INT_MAX < delta ) ? INT_MAX : (int)delta;
                        Print( "%.*s", toPrint, p );
                        p += toPrint;
                    }
                    bool entityPatternPrinted = false;
                    for( int i=0; i<NUM_ENTITIES; ++i ) {
                        if ( entities[i].value == *q ) {
                            Print( "&%s;", entities[i].pattern );
                            entityPatternPrinted = true;
                            break;
                        }
                    }
                    if ( !entityPatternPrinted ) {
                        // TIXMLASSERT( entityPatternPrinted ) causes gcc -Wunused-but-set-variable in release
                        TIXMLASSERT( false );
                    }
                    ++p;
                }
            }
            ++q;
            TIXMLASSERT( p <= q );
        }
    }
    // Flush the remaining string. This will be the entire
    // string if an entity wasn't found.
    TIXMLASSERT( p <= q );
    if ( !_processEntities || ( p < q ) ) {
        Print( "%s", p );
    }
}